

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionOK.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionOK::write_cpp
          (InstructionOK *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  bool bVar1;
  StreamSep *pSVar2;
  StreamSep local_180;
  StreamSepMaker local_138;
  StreamSep local_b0;
  StreamSep local_68;
  
  bVar1 = CppEmitter::interruptible(cpp_emitter);
  if (bVar1) {
    StreamSepMaker::operator<<((StreamSep *)&local_138,ss,(char (*) [27])0x177fe6);
    cpp_emitter->nb_cont_label = cpp_emitter->nb_cont_label + 1;
    pSVar2 = StreamSep::operator<<((StreamSep *)&local_138,&cpp_emitter->nb_cont_label);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x1775c3);
    StreamSep::~StreamSep((StreamSep *)&local_138);
  }
  StreamSepMaker::operator<<(&local_68,ss,(char (*) [15])"return RET_OK;");
  StreamSep::~StreamSep(&local_68);
  bVar1 = CppEmitter::interruptible(cpp_emitter);
  if (bVar1) {
    StreamSepMaker::rm_beg(&local_138,es,2);
    StreamSepMaker::operator<<(&local_180,&local_138,(char (*) [3])0x178133);
    pSVar2 = StreamSep::operator<<(&local_180,&cpp_emitter->nb_cont_label);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x1776d7);
    StreamSep::~StreamSep(&local_180);
    StreamSepMaker::~StreamSepMaker(&local_138);
    StreamSepMaker::operator<<(&local_b0,es,(char (*) [21])"return RET_ENDED_OK;");
    StreamSep::~StreamSep(&local_b0);
  }
  return;
}

Assistant:

void InstructionOK::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->interruptible() )
        ss << "HPIPE_DATA.inp_cont = &&c_" << ++cpp_emitter->nb_cont_label << ";";

    ss << "return RET_OK;";

    if ( cpp_emitter->interruptible() ) {
        es.rm_beg( 2 ) << "c_" << cpp_emitter->nb_cont_label << ":";
        es << "return RET_ENDED_OK;";
    }
}